

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void despot::option::PrintUsageImplementation::printUsage
               (IStringWriter *write,Descriptor *usage,int width,int last_column_min_percent,
               int last_column_own_line_max_percent)

{
  bool bVar1;
  bool bVar2;
  int i2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  LineWrapper *local_2f8;
  int local_2ac;
  LineWrapper *pLStack_2a8;
  int _;
  LineWrapper *lineWrapper;
  undefined1 local_298 [4];
  int x;
  LineWrapper interjectionLineWrapper;
  LineWrapper lastColumnLineWrapper;
  int local_e0;
  int iStack_dc;
  bool print_last_column_on_own_line;
  int rightwidth;
  int i_2;
  int tabstop [8];
  int local_ac;
  int local_a8;
  int i_1;
  int i;
  int overlong_column_threshold;
  int leftwidth;
  int lastcolumn;
  int col_width [8];
  undefined1 local_70 [4];
  int maxcolumns;
  LinePartIterator part;
  int last_column_own_line_max_width;
  int last_column_min_width;
  int last_column_own_line_max_percent_local;
  int last_column_min_percent_local;
  int width_local;
  Descriptor *usage_local;
  IStringWriter *write_local;
  
  last_column_own_line_max_percent_local = width;
  if (width < 1) {
    last_column_own_line_max_percent_local = 0x50;
  }
  if (10000 < last_column_own_line_max_percent_local) {
    last_column_own_line_max_percent_local = 10000;
  }
  part._60_4_ = (last_column_own_line_max_percent_local * last_column_own_line_max_percent + 0x32) /
                100;
  if (part._60_4_ == 0) {
    part._60_4_ = 1;
  }
  LinePartIterator::LinePartIterator((LinePartIterator *)local_70,usage);
  do {
    bVar1 = LinePartIterator::nextTable((LinePartIterator *)local_70);
    if (!bVar1) {
      return;
    }
    col_width[7] = 8;
    i_1 = 10000;
    do {
      overlong_column_threshold = 0;
      for (local_a8 = 0; local_a8 < 8; local_a8 = local_a8 + 1) {
        (&leftwidth)[local_a8] = 0;
      }
      LinePartIterator::restartTable((LinePartIterator *)local_70);
      while (bVar1 = LinePartIterator::nextRow((LinePartIterator *)local_70), bVar1) {
LAB_00218b2e:
        bVar1 = LinePartIterator::next((LinePartIterator *)local_70);
        if (bVar1) {
          iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
          if (iVar4 < 8) {
            iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
            upmax(&overlong_column_threshold,iVar4);
            iVar4 = LinePartIterator::screenLength((LinePartIterator *)local_70);
            if (iVar4 < i_1) {
              iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
              if ((iVar4 < 1) &&
                 (iVar4 = LinePartIterator::line((LinePartIterator *)local_70), iVar4 < 1)) {
                pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
                iVar4 = LinePartIterator::length((LinePartIterator *)local_70);
                if (pcVar5[iVar4] != '\t') {
                  pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
                  iVar4 = LinePartIterator::length((LinePartIterator *)local_70);
                  if (pcVar5[iVar4] != '\v') goto LAB_00218b2e;
                }
              }
              iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
              i2 = LinePartIterator::screenLength((LinePartIterator *)local_70);
              upmax(&leftwidth + iVar4,i2);
            }
          }
          goto LAB_00218b2e;
        }
      }
      i = 0;
      i_1 = 0;
      for (local_ac = 0; local_ac < overlong_column_threshold; local_ac = local_ac + 1) {
        i = (&leftwidth)[local_ac] + i;
        upmax(&i_1,(&leftwidth)[local_ac]);
      }
    } while (last_column_own_line_max_percent_local < i);
    rightwidth = 0;
    for (iStack_dc = 1; iStack_dc < 8; iStack_dc = iStack_dc + 1) {
      (&rightwidth)[iStack_dc] = (&rightwidth)[iStack_dc + -1] + (&leftwidth)[iStack_dc + -1];
    }
    local_e0 = last_column_own_line_max_percent_local - (&rightwidth)[overlong_column_threshold];
    bVar1 = false;
    if ((local_e0 < (last_column_own_line_max_percent_local * last_column_min_percent + 0x32) / 100)
       && (local_e0 < (&leftwidth)[overlong_column_threshold])) {
      bVar1 = true;
      local_e0 = part._60_4_;
    }
    if (overlong_column_threshold == 0) {
      bVar1 = false;
    }
    LineWrapper::LineWrapper
              ((LineWrapper *)&interjectionLineWrapper.wrote_something,
               last_column_own_line_max_percent_local - local_e0,
               last_column_own_line_max_percent_local);
    LineWrapper::LineWrapper((LineWrapper *)local_298,0,last_column_own_line_max_percent_local);
    LinePartIterator::restartTable((LinePartIterator *)local_70);
    while (bVar2 = LinePartIterator::nextRow((LinePartIterator *)local_70), bVar2) {
      lineWrapper._4_4_ = -1;
      while (bVar2 = LinePartIterator::next((LinePartIterator *)local_70), bVar2) {
        iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
        if (iVar4 <= overlong_column_threshold) {
          iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
          if (iVar4 == 0) {
            if (-1 < lineWrapper._4_4_) {
              (*write->_vptr_IStringWriter[2])(write,"\n",1);
            }
            lineWrapper._4_4_ = 0;
          }
          iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
          indent(write,(int *)((long)&lineWrapper + 4),(&rightwidth)[iVar4]);
          iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
          if (iVar4 < overlong_column_threshold) {
            iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
            if ((iVar4 < 1) &&
               (iVar4 = LinePartIterator::line((LinePartIterator *)local_70), iVar4 < 1)) {
              pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
              iVar4 = LinePartIterator::length((LinePartIterator *)local_70);
              if (pcVar5[iVar4] != '\t') {
                pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
                iVar4 = LinePartIterator::length((LinePartIterator *)local_70);
                if (pcVar5[iVar4] != '\v') goto LAB_00218f38;
              }
            }
            pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
            uVar3 = LinePartIterator::length((LinePartIterator *)local_70);
            (*write->_vptr_IStringWriter[2])(write,pcVar5,(ulong)uVar3);
            iVar4 = LinePartIterator::screenLength((LinePartIterator *)local_70);
            lineWrapper._4_4_ = iVar4 + lineWrapper._4_4_;
          }
          else {
LAB_00218f38:
            iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
            if (iVar4 == 0) {
              local_2f8 = (LineWrapper *)local_298;
            }
            else {
              local_2f8 = (LineWrapper *)&interjectionLineWrapper.wrote_something;
            }
            pLStack_2a8 = local_2f8;
            if (!bVar1) {
              pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
              iVar4 = LinePartIterator::length((LinePartIterator *)local_70);
              LineWrapper::process(local_2f8,write,pcVar5,iVar4);
            }
          }
        }
      }
      if (bVar1) {
        LinePartIterator::restartRow((LinePartIterator *)local_70);
        while (bVar2 = LinePartIterator::next((LinePartIterator *)local_70), bVar2) {
          iVar4 = LinePartIterator::column((LinePartIterator *)local_70);
          if (iVar4 == overlong_column_threshold) {
            (*write->_vptr_IStringWriter[2])(write,"\n",1);
            local_2ac = 0;
            indent(write,&local_2ac,last_column_own_line_max_percent_local - local_e0);
            pcVar5 = LinePartIterator::data((LinePartIterator *)local_70);
            iVar4 = LinePartIterator::length((LinePartIterator *)local_70);
            LineWrapper::process
                      ((LineWrapper *)&interjectionLineWrapper.wrote_something,write,pcVar5,iVar4);
          }
        }
      }
      (*write->_vptr_IStringWriter[2])(write,"\n",1);
      LineWrapper::flush((LineWrapper *)&interjectionLineWrapper.wrote_something,write);
      LineWrapper::flush((LineWrapper *)local_298,write);
    }
  } while( true );
}

Assistant:

static void printUsage(IStringWriter& write, const Descriptor usage[],
		int width = 80, //
		int last_column_min_percent = 50, int last_column_own_line_max_percent =
			75) {
		if (width < 1) // protect against nonsense values
			width = 80;

		if (width > 10000) // protect against overflow in the following computation
			width = 10000;

		int last_column_min_width = ((width * last_column_min_percent) + 50)
			/ 100;
		int last_column_own_line_max_width = ((width
			* last_column_own_line_max_percent) + 50) / 100;
		if (last_column_own_line_max_width == 0)
			last_column_own_line_max_width = 1;

		LinePartIterator part(usage);
		while (part.nextTable()) {

			/***************** Determine column widths *******************************/

			const int maxcolumns = 8; // 8 columns are enough for everyone
			int col_width[maxcolumns];
			int lastcolumn;
			int leftwidth;
			int overlong_column_threshold = 10000;
			do {
				lastcolumn = 0;
				for (int i = 0; i < maxcolumns; ++i)
					col_width[i] = 0;

				part.restartTable();
				while (part.nextRow()) {
					while (part.next()) {
						if (part.column() < maxcolumns) {
							upmax(lastcolumn, part.column());
							if (part.screenLength() < overlong_column_threshold)
								// We don't let rows that don't use table separators (\t or \v) influence
								// the width of column 0. This allows the user to interject section headers
								// or explanatory paragraphs that do not participate in the table layout.
								if (part.column() > 0 || part.line() > 0
									|| part.data()[part.length()] == '\t'
									|| part.data()[part.length()] == '\v')
									upmax(col_width[part.column()],
										part.screenLength());
						}
					}
				}

				/*
				 * If the last column doesn't fit on the same
				 * line as the other columns, we can fix that by starting it on its own line.
				 * However we can't do this for any of the columns 0..lastcolumn-1.
				 * If their sum exceeds the maximum width we try to fix this by iteratively
				 * ignoring the widest line parts in the width determination until
				 * we arrive at a series of column widths that fit into one line.
				 * The result is a layout where everything is nicely formatted
				 * except for a few overlong fragments.
				 * */

				leftwidth = 0;
				overlong_column_threshold = 0;
				for (int i = 0; i < lastcolumn; ++i) {
					leftwidth += col_width[i];
					upmax(overlong_column_threshold, col_width[i]);
				}

			} while (leftwidth > width);

			/**************** Determine tab stops and last column handling **********************/

			int tabstop[maxcolumns];
			tabstop[0] = 0;
			for (int i = 1; i < maxcolumns; ++i)
				tabstop[i] = tabstop[i - 1] + col_width[i - 1];

			int rightwidth = width - tabstop[lastcolumn];
			bool print_last_column_on_own_line = false;
			if (rightwidth < last_column_min_width
				&& rightwidth < col_width[lastcolumn]) {
				print_last_column_on_own_line = true;
				rightwidth = last_column_own_line_max_width;
			}

			// If lastcolumn == 0 we must disable print_last_column_on_own_line because
			// otherwise 2 copies of the last (and only) column would be output.
			// Actually this is just defensive programming. It is currently not
			// possible that lastcolumn==0 and print_last_column_on_own_line==true
			// at the same time, because lastcolumn==0 => tabstop[lastcolumn] == 0 =>
			// rightwidth==width => rightwidth>=last_column_min_width  (unless someone passes
			// a bullshit value >100 for last_column_min_percent) => the above if condition
			// is false => print_last_column_on_own_line==false
			if (lastcolumn == 0)
				print_last_column_on_own_line = false;

			LineWrapper lastColumnLineWrapper(width - rightwidth, width);
			LineWrapper interjectionLineWrapper(0, width);

			part.restartTable();

			/***************** Print out all rows of the table *************************************/

			while (part.nextRow()) {
				int x = -1;
				while (part.next()) {
					if (part.column() > lastcolumn)
						continue; // drop excess columns (can happen if lastcolumn == maxcolumns-1)

					if (part.column() == 0) {
						if (x >= 0)
							write("\n", 1);
						x = 0;
					}

					indent(write, x, tabstop[part.column()]);

					if ((part.column() < lastcolumn)
						&& (part.column() > 0 || part.line() > 0
							|| part.data()[part.length()] == '\t'
							|| part.data()[part.length()] == '\v')) {
						write(part.data(), part.length());
						x += part.screenLength();
					} else // either part.column() == lastcolumn or we are in the special case of
						   // an interjection that doesn't contain \v or \t
					{
						// NOTE: This code block is not necessarily executed for
						// each line, because some rows may have fewer columns.

						LineWrapper& lineWrapper =
							(part.column() == 0) ?
								interjectionLineWrapper : lastColumnLineWrapper;

						if (!print_last_column_on_own_line)
							lineWrapper.process(write, part.data(),
								part.length());
					}
				} // while

				if (print_last_column_on_own_line) {
					part.restartRow();
					while (part.next()) {
						if (part.column() == lastcolumn) {
							write("\n", 1);
							int _ = 0;
							indent(write, _, width - rightwidth);
							lastColumnLineWrapper.process(write, part.data(),
								part.length());
						}
					}
				}

				write("\n", 1);
				lastColumnLineWrapper.flush(write);
				interjectionLineWrapper.flush(write);
			}
		}
	}